

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTileDescriptionAttribute.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::TileDescription>::writeValueTo
          (TypedAttribute<Imf_3_4::TileDescription> *this,OStream *os,int version)

{
  undefined8 in_RAX;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).xSize);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).ySize);
  uStack_18 = CONCAT17((byte)((this->_value).roundingMode << 4) | (byte)(this->_value).mode,
                       (undefined7)uStack_18);
  (*os->_vptr_OStream[2])(os,(long)&uStack_18 + 7,1);
  return;
}

Assistant:

IMF_EXPORT void
TileDescriptionAttribute::writeValueTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, int version) const
{
    Xdr::write<StreamIO> (os, _value.xSize);
    Xdr::write<StreamIO> (os, _value.ySize);

    unsigned char tmp = _value.mode | (_value.roundingMode << 4);
    Xdr::write<StreamIO> (os, tmp);
}